

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

bool __thiscall
VulkanHppGenerator::isSupported
          (VulkanHppGenerator *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *requiredBy)

{
  bool bVar1;
  reference name;
  bool local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *r;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *requiredBy_local;
  VulkanHppGenerator *this_local;
  
  __end1 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(requiredBy);
  r = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(requiredBy);
  while( true ) {
    bVar1 = std::operator==(&__end1,(_Self *)&r);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return false;
    }
    name = std::
           _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&__end1);
    bVar1 = isSupportedFeature(this,name);
    if ((bVar1) || (bVar1 = isSupportedExtension(this,name), bVar1)) break;
    bVar1 = isUnsupportedFeature(this,name);
    local_49 = true;
    if (!bVar1) {
      local_49 = isUnsupportedExtension(this,name);
    }
    if (local_49 == false) {
      __assert_fail("isUnsupportedFeature( r ) || isUnsupportedExtension( r )",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x346d,
                    "bool VulkanHppGenerator::isSupported(const std::set<std::string> &) const");
    }
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return true;
}

Assistant:

bool VulkanHppGenerator::isSupported( std::set<std::string> const & requiredBy ) const
{
  for ( auto const & r : requiredBy )
  {
    if ( isSupportedFeature( r ) || isSupportedExtension( r ) )
    {
      return true;
    }
    else
    {
      assert( isUnsupportedFeature( r ) || isUnsupportedExtension( r ) );
    }
  }
  return false;
}